

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

type __thiscall
chrono::ChFunctorArchiveInSpecificPtr<myEmployeeCustomConstructor>::
_archive_in_constructor<myEmployeeCustomConstructor>
          (ChFunctorArchiveInSpecificPtr<myEmployeeCustomConstructor> *this,ChArchiveIn *marchive,
          char *classname)

{
  bool bVar1;
  myEmployeeCustomConstructor *pmVar2;
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,classname,&local_41);
  bVar1 = ChClassFactory::IsClassRegistered(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_40,classname,&local_41);
    ChClassFactory::create<myEmployeeCustomConstructor>(&local_40,marchive,this->pt2Object);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    pmVar2 = (myEmployeeCustomConstructor *)
             myEmployeeCustomConstructor::ArchiveINconstructor(marchive);
    *this->pt2Object = pmVar2;
  }
  return;
}

Assistant:

typename enable_if< ChDetect_ArchiveINconstructor<Tc>::value, void >::type
        _archive_in_constructor(ChArchiveIn& marchive, const char* classname) {
            if (ChClassFactory::IsClassRegistered(std::string(classname)))
                ChClassFactory::create(std::string(classname), marchive, pt2Object);
            else
                *pt2Object = static_cast<Tc*> (Tc::ArchiveINconstructor(marchive));
        }